

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O2

void outputString(char *s,char *outBuf,int32_t *outIx,int32_t capacity,int32_t indent)

{
  char c;
  char *pcVar1;
  
  pcVar1 = "*NULL*";
  if (s != (char *)0x0) {
    pcVar1 = s;
  }
  do {
    c = *pcVar1;
    outputChar(c,outBuf,outIx,capacity,indent);
    pcVar1 = pcVar1 + 1;
  } while (c != '\0');
  return;
}

Assistant:

static void outputString(const char *s, char *outBuf, int32_t *outIx, int32_t capacity, int32_t indent) {
    int32_t i = 0;
    char    c;
    if (s==NULL) {
        s = "*NULL*";
    }
    do {
        c = s[i++];
        outputChar(c, outBuf, outIx, capacity, indent);
    } while (c != 0);
}